

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test_utils.hpp
# Opt level: O0

enable_if_t<is_olc_db<unodb::olc_db<unodb::key_view,_unodb::value_view>_>,_void> __thiscall
unodb::test::
tree_verifier<unodb::olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
::
do_insert<unodb::olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
          (tree_verifier<unodb::olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
           *this,key_type k,value_view v)

{
  bool bVar1;
  char *message;
  char *in_R9;
  string local_b8;
  AssertHelper local_98;
  Message local_90 [3];
  pointer local_78;
  size_t sStack_70;
  pointer local_68;
  size_t sStack_60;
  bool local_49;
  undefined1 local_48 [8];
  AssertionResult gtest_ar_;
  quiescent_state_on_scope_exit qsbr_after_get;
  tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *this_local;
  value_view v_local;
  key_type k_local;
  
  memset((void *)((long)&gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 + 4),0,4);
  quiescent_state_on_scope_exit::quiescent_state_on_scope_exit
            ((quiescent_state_on_scope_exit *)
             ((long)&gtest_ar_.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 4));
  local_78 = v._M_ptr;
  sStack_70 = v._M_extent._M_extent_value._M_extent_value;
  local_68 = k._M_ptr;
  sStack_60 = k._M_extent._M_extent_value._M_extent_value;
  local_49 = olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
             ::insert((olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                       *)(this + 0x80),k,v);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_48,&local_49,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
  if (!bVar1) {
    testing::Message::Message(local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b8,(internal *)local_48,(AssertionResult *)"test_db.insert(k, v)","false",
               "true",in_R9);
    message = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                        (&local_b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
               ,0x119,message);
    testing::internal::AssertHelper::operator=(&local_98,local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    testing::Message::~Message(local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
  quiescent_state_on_scope_exit::~quiescent_state_on_scope_exit
            ((quiescent_state_on_scope_exit *)
             ((long)&gtest_ar_.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 4));
  return;
}

Assistant:

std::enable_if_t<is_olc_db<Db2>, void> do_insert(key_type k,
                                                   unodb::value_view v) {
    const quiescent_state_on_scope_exit qsbr_after_get{};
    UNODB_ASSERT_TRUE(test_db.insert(k, v));
  }